

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.c
# Opt level: O0

int lcall_address(em8051 *aCPU)

{
  em8051 *aCPU_local;
  
  push_to_stack(aCPU,aCPU->mPC + 3U & 0xff);
  push_to_stack(aCPU,aCPU->mPC + 3 >> 8);
  aCPU->mPC = (uint)CONCAT11(aCPU->mCodeMem[(int)(aCPU->mPC + 1U & aCPU->mCodeMemSize - 1U)],
                             aCPU->mCodeMem[(int)(aCPU->mPC + 2U & aCPU->mCodeMemSize - 1U)]);
  return 1;
}

Assistant:

static int lcall_address(struct em8051 *aCPU)
{
    push_to_stack(aCPU, (PC + 3) & 0xff);
    push_to_stack(aCPU, (PC + 3) >> 8);
    PC = (aCPU->mCodeMem[(PC + 1) & (aCPU->mCodeMemSize-1)] << 8) | 
         (aCPU->mCodeMem[(PC + 2) & (aCPU->mCodeMemSize-1)] << 0);
    return 1;
}